

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double local_18;
  double local_10;
  double local_8;
  
  local_8 = 2.0;
  local_10 = 1.0;
  local_18 = 1e-12;
  dVar2 = numerary::Numerary::incgamma(&local_8,&local_10,&local_18);
  std::operator<<((ostream *)&std::cout,"IncGamma(2, 1) = ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {

    double value;

    value = Numerary::incgamma(2, 1);

    cout << "IncGamma(2, 1) = " << value << endl;
    
    return 0;
}